

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

StringDictionaryContainer
duckdb::UncompressedStringStorage::GetDictionary(ColumnSegment *segment,BufferHandle *handle)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(handle);
  return *(StringDictionaryContainer *)(pdVar1 + segment->offset);
}

Assistant:

StringDictionaryContainer UncompressedStringStorage::GetDictionary(ColumnSegment &segment, BufferHandle &handle) {
	auto startptr = handle.Ptr() + segment.GetBlockOffset();
	StringDictionaryContainer container;
	container.size = Load<uint32_t>(startptr);
	container.end = Load<uint32_t>(startptr + sizeof(uint32_t));
	return container;
}